

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine>
          (QMovableArrayOps<QToolBarAreaLayoutLine> *this,qsizetype i,QToolBarAreaLayoutLine *args)

{
  QToolBarAreaLayoutLine **ppQVar1;
  qsizetype *pqVar2;
  QToolBarAreaLayoutLine *pQVar3;
  Orientation OVar4;
  long lVar5;
  Data *pDVar6;
  QToolBarAreaLayoutLine *pQVar7;
  Data *pDVar8;
  QToolBarAreaLayoutItem *pQVar9;
  qsizetype qVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  long in_FS_OFFSET;
  bool bVar18;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
           super_QArrayDataPointer<QToolBarAreaLayoutLine>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b3ab9:
    OVar4 = args->o;
    uVar14 = (args->rect).x1;
    uVar15 = (args->rect).y1;
    uVar16 = (args->rect).x2;
    uVar17 = (args->rect).y2;
    pDVar8 = (args->toolBarItems).d.d;
    pQVar9 = (args->toolBarItems).d.ptr;
    (args->toolBarItems).d.d = (Data *)0x0;
    qVar10 = (args->toolBarItems).d.size;
    (args->toolBarItems).d.ptr = (QToolBarAreaLayoutItem *)0x0;
    (args->toolBarItems).d.size = 0;
    bVar18 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
             super_QArrayDataPointer<QToolBarAreaLayoutLine>.size != 0;
    QArrayDataPointer<QToolBarAreaLayoutLine>::detachAndGrow
              ((QArrayDataPointer<QToolBarAreaLayoutLine> *)this,(uint)(i == 0 && bVar18),1,
               (QToolBarAreaLayoutLine **)0x0,(QArrayDataPointer<QToolBarAreaLayoutLine> *)0x0);
    pQVar7 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
             super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr;
    if (i != 0 || !bVar18) {
      pQVar3 = pQVar7 + i;
      memmove(pQVar3 + 1,pQVar7 + i,
              ((this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
               super_QArrayDataPointer<QToolBarAreaLayoutLine>.size - i) * 0x30);
      (pQVar3->rect).x1.m_i = uVar14;
      (pQVar3->rect).y1.m_i = uVar15;
      (pQVar3->rect).x2.m_i = uVar16;
      (pQVar3->rect).y2.m_i = uVar17;
      pQVar3->o = OVar4;
      (pQVar3->toolBarItems).d.d = pDVar8;
      (pQVar3->toolBarItems).d.ptr = pQVar9;
      (pQVar3->toolBarItems).d.size = qVar10;
      goto LAB_004b3b80;
    }
    pQVar7[-1].o = OVar4;
    pQVar7[-1].rect.x1.m_i = uVar14;
    pQVar7[-1].rect.y1.m_i = uVar15;
    pQVar7[-1].rect.x2.m_i = uVar16;
    pQVar7[-1].rect.y2.m_i = uVar17;
    pQVar7[-1].toolBarItems.d.d = pDVar8;
    pQVar7[-1].toolBarItems.d.ptr = pQVar9;
    pQVar7[-1].toolBarItems.d.size = qVar10;
  }
  else {
    if (((this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
         super_QArrayDataPointer<QToolBarAreaLayoutLine>.size == i) &&
       (pQVar7 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                 super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr,
       (pDVar6->super_QArrayData).alloc - i !=
       ((long)((long)pQVar7 -
              ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pQVar7[i].o = args->o;
      iVar11 = (args->rect).y1.m_i;
      iVar12 = (args->rect).x2.m_i;
      iVar13 = (args->rect).y2.m_i;
      pQVar3 = pQVar7 + i;
      (pQVar3->rect).x1.m_i = (args->rect).x1.m_i;
      (pQVar3->rect).y1.m_i = iVar11;
      (pQVar3->rect).x2.m_i = iVar12;
      (pQVar3->rect).y2.m_i = iVar13;
      pDVar8 = (args->toolBarItems).d.d;
      (args->toolBarItems).d.d = (Data *)0x0;
      pQVar7[i].toolBarItems.d.d = pDVar8;
      pQVar9 = (args->toolBarItems).d.ptr;
      (args->toolBarItems).d.ptr = (QToolBarAreaLayoutItem *)0x0;
      pQVar7[i].toolBarItems.d.ptr = pQVar9;
      qVar10 = (args->toolBarItems).d.size;
      (args->toolBarItems).d.size = 0;
      pQVar7[i].toolBarItems.d.size = qVar10;
      goto LAB_004b3b80;
    }
    if ((i != 0) ||
       (pQVar7 = (this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
                 super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr,
       (QToolBarAreaLayoutLine *)
       ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar7))
    goto LAB_004b3ab9;
    pQVar7[-1].o = args->o;
    iVar11 = (args->rect).y1.m_i;
    iVar12 = (args->rect).x2.m_i;
    iVar13 = (args->rect).y2.m_i;
    pQVar7[-1].rect.x1.m_i = (args->rect).x1.m_i;
    pQVar7[-1].rect.y1.m_i = iVar11;
    pQVar7[-1].rect.x2.m_i = iVar12;
    pQVar7[-1].rect.y2.m_i = iVar13;
    pDVar8 = (args->toolBarItems).d.d;
    (args->toolBarItems).d.d = (Data *)0x0;
    pQVar7[-1].toolBarItems.d.d = pDVar8;
    pQVar9 = (args->toolBarItems).d.ptr;
    (args->toolBarItems).d.ptr = (QToolBarAreaLayoutItem *)0x0;
    pQVar7[-1].toolBarItems.d.ptr = pQVar9;
    qVar10 = (args->toolBarItems).d.size;
    (args->toolBarItems).d.size = 0;
    pQVar7[-1].toolBarItems.d.size = qVar10;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
             super_QArrayDataPointer<QToolBarAreaLayoutLine>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_004b3b80:
  pqVar2 = &(this->super_QGenericArrayOps<QToolBarAreaLayoutLine>).
            super_QArrayDataPointer<QToolBarAreaLayoutLine>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }